

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupByState.hpp
# Opt level: O0

void __thiscall
linq::
GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>
::Init(GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>
       *this)

{
  bool bVar1;
  mapped_type *this_00;
  iterator iVar2;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *this_01;
  key_type_conflict local_d9;
  int *local_d8;
  int *x;
  undefined1 local_88 [8];
  iterator __end0;
  iterator __begin0;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *__range2;
  GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>
  *this_local;
  
  this_01 = &this->source;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::Init
            (this_01);
  std::
  map<bool,_std::vector<int,_std::allocator<int>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear(&this->result);
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::begin
            ((iterator *)&__end0.valid,this_01);
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::end
            ((iterator *)local_88,this_01);
  while( true ) {
    IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::iterator::
    iterator((iterator *)&x,(iterator *)local_88);
    bVar1 = IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::
            iterator::operator!=((iterator *)&__end0.valid,(iterator *)&x);
    IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::iterator::
    ~iterator((iterator *)&x);
    if (!bVar1) break;
    local_d8 = IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>
               ::iterator::operator*((iterator *)&__end0.valid);
    local_d9 = std::function<bool_(const_int_&)>::operator()(&this->transformer,local_d8);
    this_00 = std::
              map<bool,_std::vector<int,_std::allocator<int>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](&this->result,&local_d9);
    std::vector<int,_std::allocator<int>_>::push_back(this_00,local_d8);
    IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::iterator::
    operator++((iterator *)&__end0.valid);
  }
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::iterator::
  ~iterator((iterator *)local_88);
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::iterator::
  ~iterator((iterator *)&__end0.valid);
  iVar2 = std::
          map<bool,_std::vector<int,_std::allocator<int>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::begin(&this->result);
  (this->current)._M_node = iVar2._M_node;
  return;
}

Assistant:

void Init() override 
			{
				source.Init();
				result.clear();
				
				for(const auto& x : source)
					result[transformer(x)].push_back(x);
				
				current = result.begin();
			}